

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

Clifford * operator*(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  pointer *ppBVar1;
  iterator iVar2;
  pointer pBVar3;
  Blade local_40;
  float local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = tv;
  if (ABS(tv) <= 1e-06) {
    Blade::Blade(&local_40);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                (__return_storage_ptr__,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    Blade::~Blade(&local_40);
  }
  else {
    pBVar3 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (pBVar3 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        Blade::Blade(&local_40,pBVar3->mBase,pBVar3->mVal * local_38);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_40);
        }
        else {
          *iVar2._M_current = local_40;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_40);
        pBVar3 = pBVar3 + 1;
      } while (pBVar3 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(float tv, Clifford A)
{
	Clifford R;
	idx a=A.begin();
	if(fabs(tv)>Error2)
	{
		while(a!=A.end())
		{	
		R.push_back(Blade(a->mBase,tv*a->mVal));
		a++;
		}
	return R;
	}
	else
	{
	R.push_back(Blade());
	}
	return R;
}